

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_stream.c
# Opt level: O2

int mk_channel_clean(mk_channel *channel)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  mk_list *pmVar4;
  mk_list *pmVar5;
  
  pmVar5 = (channel->streams).next;
  while (pmVar5 != &channel->streams) {
    pmVar1 = pmVar5->next;
    pmVar4 = pmVar5[-1].next;
    while (pmVar4 != pmVar5 + -1) {
      pmVar2 = pmVar4->next;
      mk_stream_in_release((mk_stream_input *)&pmVar4[-5].next);
      pmVar4 = pmVar2;
    }
    pmVar4 = pmVar5[-1].next;
    while (pmVar4 != pmVar5 + -1) {
      pmVar2 = pmVar4->next;
      mk_stream_in_release((mk_stream_input *)&pmVar4[-5].next);
      pmVar4 = pmVar2;
    }
    pmVar4 = pmVar5 + -6;
    if (pmVar5[-3].next != (mk_list *)0x0) {
      (*(code *)pmVar5[-3].next)(&pmVar4->next);
    }
    pmVar5[-4].next = (mk_list *)0x0;
    pmVar2 = pmVar5->prev;
    pmVar3 = pmVar5->next;
    pmVar2->next = pmVar3;
    pmVar3->prev = pmVar2;
    pmVar5->prev = (mk_list *)0x0;
    pmVar5->next = (mk_list *)0x0;
    pmVar2 = pmVar5 + -5;
    pmVar5 = pmVar1;
    if (*(int *)&pmVar2->prev == 1) {
      free(&pmVar4->next);
    }
  }
  return 0;
}

Assistant:

int mk_channel_clean(struct mk_channel *channel)
{
    struct mk_list *tmp;
    struct mk_list *tmp_in;
    struct mk_list *head;
    struct mk_list *head_in;
    struct mk_stream *stream;
    struct mk_stream_input *in;

    mk_list_foreach_safe(head, tmp, &channel->streams) {
        stream = mk_list_entry(head, struct mk_stream, _head);
        mk_list_foreach_safe(head_in, tmp_in, &stream->inputs) {
            in = mk_list_entry(head_in, struct mk_stream_input, _head);
            mk_stream_in_release(in);
        }
        mk_stream_release(stream);
    }

    return 0;
}